

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::filter(Fl_File_Chooser *this,char *p)

{
  bool bVar1;
  char *__ptr;
  char *pcVar2;
  char *pcVar3;
  int dstsize;
  char cVar4;
  char *pcVar5;
  char temp [2048];
  char local_838 [2056];
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    p = "*";
  }
  __ptr = strdup(p);
  Fl_Menu_::clear(&this->showChoice->super_Fl_Menu_);
  if (__ptr == (char *)0x0) {
    free((void *)0x0);
  }
  else {
    bVar1 = false;
    pcVar3 = __ptr;
    do {
      cVar4 = *pcVar3;
      if (cVar4 == '\0') break;
      pcVar2 = strchr(pcVar3,9);
      if (pcVar2 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = pcVar2 + 1;
        *pcVar2 = '\0';
        cVar4 = *pcVar3;
      }
      if ((cVar4 == '*') && (pcVar3[1] == '\0')) {
        Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
        bVar1 = true;
      }
      else {
        quote_pathname(local_838,pcVar3,dstsize);
        Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,local_838);
        pcVar3 = strstr(pcVar3,"(*)");
        if (pcVar3 != (char *)0x0) {
          bVar1 = true;
        }
      }
      pcVar3 = pcVar5;
    } while (pcVar5 != (char *)0x0);
    free(__ptr);
    if (bVar1) goto LAB_0020148e;
  }
  Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
LAB_0020148e:
  Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,custom_filter_label);
  Fl_Choice::value(this->showChoice,0);
  showChoiceCB(this);
  return;
}

Assistant:

void
Fl_File_Chooser::filter(const char *p)		// I - Pattern(s)
{
  char		*copyp,				// Copy of pattern
		*start,				// Start of pattern
		*end;				// End of pattern
  int		allfiles;			// Do we have a "*" pattern?
  char		temp[FL_PATH_MAX];			// Temporary pattern string


  // Make sure we have a pattern...
  if (!p || !*p) p = "*";

  // Copy the pattern string...
  copyp = strdup(p);

  // Separate the pattern string as necessary...
  showChoice->clear();

  for (start = copyp, allfiles = 0; start && *start; start = end) {
    end = strchr(start, '\t');
    if (end) *end++ = '\0';

    if (strcmp(start, "*") == 0) {
      showChoice->add(all_files_label);
      allfiles = 1;
    } else {
      quote_pathname(temp, start, sizeof(temp));
      showChoice->add(temp);
      if (strstr(start, "(*)") != NULL) allfiles = 1;
    }
  }

  free(copyp);

  if (!allfiles) showChoice->add(all_files_label);

  showChoice->add(custom_filter_label);
  
  showChoice->value(0);
  showChoiceCB();
}